

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O3

int Curl_poll(pollfd *ufds,uint nfds,int timeout_ms)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  int *piVar5;
  long lVar6;
  ushort uVar7;
  ulong __nfds;
  timeval older;
  timeval newer;
  
  if (nfds != 0 && ufds != (pollfd *)0x0) {
    __nfds = (ulong)nfds;
    uVar4 = 0;
    do {
      if (ufds[uVar4].fd != -1) {
        if (timeout_ms < 1) {
          iVar2 = 0;
          older = (timeval)ZEXT816(0);
        }
        else {
          older = curlx_tvnow();
          iVar2 = timeout_ms;
        }
        if (timeout_ms == 0) {
          iVar2 = 0;
        }
        if (timeout_ms < 0) {
          iVar2 = -1;
        }
        iVar3 = poll((pollfd *)ufds,__nfds,iVar2);
        if (iVar3 != -1) goto LAB_00565174;
        piVar5 = __errno_location();
        goto LAB_0056510d;
      }
      uVar4 = uVar4 + 1;
    } while (__nfds != uVar4);
  }
  iVar2 = Curl_wait_ms(timeout_ms);
  return iVar2;
LAB_0056510d:
  do {
    if (*piVar5 != 0) {
      if (*piVar5 != 4) {
        return -1;
      }
      if (Curl_ack_eintr != 0) {
        return -1;
      }
    }
    if (0 < timeout_ms) {
      newer = curlx_tvnow();
      lVar6 = curlx_tvdiff(newer,older);
      iVar2 = timeout_ms - (int)lVar6;
      if (iVar2 == 0 || timeout_ms < (int)lVar6) goto LAB_005651b9;
    }
    if (timeout_ms == 0) {
      iVar2 = 0;
    }
    if (timeout_ms < 0) {
      iVar2 = -1;
    }
    iVar3 = poll((pollfd *)ufds,__nfds,iVar2);
  } while (iVar3 == -1);
LAB_00565174:
  iVar2 = -1;
  if (-1 < iVar3) {
    if (iVar3 == 0) {
LAB_005651b9:
      iVar2 = 0;
    }
    else {
      uVar4 = 0;
      do {
        if ((ufds[uVar4].fd != -1) && (uVar1 = ufds[uVar4].revents, (uVar1 & 0x18) != 0)) {
          uVar7 = uVar1 >> 4 & 1;
          if ((uVar1 & 8) != 0) {
            uVar7 = 5;
          }
          ufds[uVar4].revents = uVar7 | uVar1;
        }
        uVar4 = uVar4 + 1;
        iVar2 = iVar3;
      } while (__nfds != uVar4);
    }
  }
  return iVar2;
}

Assistant:

int Curl_poll(struct pollfd ufds[], unsigned int nfds, int timeout_ms)
{
#ifndef HAVE_POLL_FINE
  struct timeval pending_tv;
  struct timeval *ptimeout;
  fd_set fds_read;
  fd_set fds_write;
  fd_set fds_err;
  curl_socket_t maxfd;
#endif
  struct timeval initial_tv = {0, 0};
  bool fds_none = TRUE;
  unsigned int i;
  int pending_ms = 0;
  int error;
  int r;

  if(ufds) {
    for(i = 0; i < nfds; i++) {
      if(ufds[i].fd != CURL_SOCKET_BAD) {
        fds_none = FALSE;
        break;
      }
    }
  }
  if(fds_none) {
    r = Curl_wait_ms(timeout_ms);
    return r;
  }

  /* Avoid initial timestamp, avoid curlx_tvnow() call, when elapsed
     time in this function does not need to be measured. This happens
     when function is called with a zero timeout or a negative timeout
     value indicating a blocking call should be performed. */

  if(timeout_ms > 0) {
    pending_ms = timeout_ms;
    initial_tv = curlx_tvnow();
  }

#ifdef HAVE_POLL_FINE

  do {
    if(timeout_ms < 0)
      pending_ms = -1;
    else if(!timeout_ms)
      pending_ms = 0;
    r = poll(ufds, nfds, pending_ms);
    if(r != -1)
      break;
    error = SOCKERRNO;
    if(error && error_not_EINTR)
      break;
    if(timeout_ms > 0) {
      pending_ms = timeout_ms - elapsed_ms;
      if(pending_ms <= 0) {
        r = 0;  /* Simulate a "call timed out" case */
        break;
      }
    }
  } while(r == -1);

  if(r < 0)
    return -1;
  if(r == 0)
    return 0;

  for(i = 0; i < nfds; i++) {
    if(ufds[i].fd == CURL_SOCKET_BAD)
      continue;
    if(ufds[i].revents & POLLHUP)
      ufds[i].revents |= POLLIN;
    if(ufds[i].revents & POLLERR)
      ufds[i].revents |= (POLLIN|POLLOUT);
  }

#else  /* HAVE_POLL_FINE */

  FD_ZERO(&fds_read);
  FD_ZERO(&fds_write);
  FD_ZERO(&fds_err);
  maxfd = (curl_socket_t)-1;

  for(i = 0; i < nfds; i++) {
    ufds[i].revents = 0;
    if(ufds[i].fd == CURL_SOCKET_BAD)
      continue;
    VERIFY_SOCK(ufds[i].fd);
    if(ufds[i].events & (POLLIN|POLLOUT|POLLPRI|
                          POLLRDNORM|POLLWRNORM|POLLRDBAND)) {
      if(ufds[i].fd > maxfd)
        maxfd = ufds[i].fd;
      if(ufds[i].events & (POLLRDNORM|POLLIN))
        FD_SET(ufds[i].fd, &fds_read);
      if(ufds[i].events & (POLLWRNORM|POLLOUT))
        FD_SET(ufds[i].fd, &fds_write);
      if(ufds[i].events & (POLLRDBAND|POLLPRI))
        FD_SET(ufds[i].fd, &fds_err);
    }
  }

#ifdef USE_WINSOCK
  /* WinSock select() can't handle zero events.  See the comment about this in
     Curl_check_socket(). */
  if(fds_read.fd_count == 0 && fds_write.fd_count == 0
     && fds_err.fd_count == 0) {
    r = Curl_wait_ms(timeout_ms);
    return r;
  }
#endif

  ptimeout = (timeout_ms < 0) ? NULL : &pending_tv;

  do {
    if(timeout_ms > 0) {
      pending_tv.tv_sec = pending_ms / 1000;
      pending_tv.tv_usec = (pending_ms % 1000) * 1000;
    }
    else if(!timeout_ms) {
      pending_tv.tv_sec = 0;
      pending_tv.tv_usec = 0;
    }
    r = select((int)maxfd + 1,
#ifndef USE_WINSOCK
               &fds_read, &fds_write, &fds_err,
#else
               /* WinSock select() can't handle fd_sets with zero bits set, so
                  don't give it such arguments.  See the comment about this in
                  Curl_check_socket().
               */
               fds_read.fd_count ? &fds_read : NULL,
               fds_write.fd_count ? &fds_write : NULL,
               fds_err.fd_count ? &fds_err : NULL,
#endif
               ptimeout);
    if(r != -1)
      break;
    error = SOCKERRNO;
    if(error && error_not_EINTR)
      break;
    if(timeout_ms > 0) {
      pending_ms = timeout_ms - elapsed_ms;
      if(pending_ms <= 0) {
        r = 0;  /* Simulate a "call timed out" case */
        break;
      }
    }
  } while(r == -1);

  if(r < 0)
    return -1;
  if(r == 0)
    return 0;

  r = 0;
  for(i = 0; i < nfds; i++) {
    ufds[i].revents = 0;
    if(ufds[i].fd == CURL_SOCKET_BAD)
      continue;
    if(FD_ISSET(ufds[i].fd, &fds_read))
      ufds[i].revents |= POLLIN;
    if(FD_ISSET(ufds[i].fd, &fds_write))
      ufds[i].revents |= POLLOUT;
    if(FD_ISSET(ufds[i].fd, &fds_err))
      ufds[i].revents |= POLLPRI;
    if(ufds[i].revents != 0)
      r++;
  }

#endif  /* HAVE_POLL_FINE */

  return r;
}